

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.h
# Opt level: O2

void __thiscall
cmEventBasedConnection::cmEventBasedConnection
          (cmEventBasedConnection *this,cmConnectionBufferStrategy *bufferStrategy)

{
  (this->super_cmConnection).Server = (cmServerBase *)0x0;
  (this->super_cmConnection)._vptr_cmConnection = (_func_int **)&PTR_WriteData_005c5700;
  (this->WriteStream).super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->WriteStream).super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->RawReadBuffer)._M_dataplus._M_p = (pointer)&(this->RawReadBuffer).field_2;
  (this->RawReadBuffer)._M_string_length = 0;
  (this->RawReadBuffer).field_2._M_local_buf[0] = '\0';
  (this->BufferStrategy)._M_t.
  super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
  .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl = bufferStrategy;
  return;
}

Assistant:

cmConnection() = default;